

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_3::DepthRangeEvaluator::evaluate
          (DepthRangeEvaluator *this,ShaderEvalContext *c)

{
  DepthRangeParams DVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  Vector<float,_3> local_28;
  VecAccess<float,_4,_3> local_18;
  
  DVar1 = *this->m_params;
  auVar4._8_8_ = 0;
  auVar4._0_4_ = DVar1.zNear;
  auVar4._4_4_ = DVar1.zFar;
  auVar4 = minps(_DAT_005a2880,auVar4);
  fVar2 = (float)(-(uint)(0.0 < DVar1.zNear) & auVar4._0_4_);
  fVar3 = (float)(-(uint)(0.0 < DVar1.zFar) & auVar4._4_4_);
  local_28.m_data[2] = (fVar3 - fVar2) * 0.5 + 0.5;
  local_28.m_data[1] = fVar3;
  local_28.m_data[0] = fVar2;
  local_18.m_vector = &c->color;
  local_18.m_index[0] = 0;
  local_18.m_index[1] = 1;
  local_18.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_18,&local_28);
  return;
}

Assistant:

void evaluate (gls::ShaderEvalContext& c)
	{
		float zNear	= deFloatClamp(m_params.zNear, 0.0f, 1.0f);
		float zFar	= deFloatClamp(m_params.zFar, 0.0f, 1.0f);
		float diff	= zFar - zNear;
		c.color.xyz() = tcu::Vec3(zNear, zFar, diff*0.5f + 0.5f);
	}